

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_socket.c
# Opt level: O1

ssize_t send_parts(int fd,msghdr *msg,int flags)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong __n;
  
  uVar2 = (ulong)bytes_to_send * 9;
  if (msg->msg_iovlen != 0) {
    uVar6 = 0;
    uVar3 = 0;
    uVar4 = uVar2;
    uVar5 = 1;
    do {
      __n = msg->msg_iov[uVar3].iov_len;
      if (uVar4 < __n) {
        __n = uVar4;
      }
      memcpy(send_buffer + uVar6,msg->msg_iov[uVar3].iov_base,__n);
      uVar4 = uVar4 - __n;
      if (uVar4 == 0) {
        return uVar2;
      }
      uVar6 = (ulong)(uint)((int)uVar6 + (int)__n);
      bVar1 = uVar5 < msg->msg_iovlen;
      uVar3 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  return uVar2;
}

Assistant:

static ssize_t send_parts(int fd, const struct msghdr *msg, int flags)
{
	(void)fd;
	(void)flags;
	unsigned int len = 0;
	size_t remaining_bytes = bytes_to_send;
	for (unsigned int i = 0; i < msg->msg_iovlen; i++) {
		size_t minimum = CIO_MIN(remaining_bytes, msg->msg_iov[i].iov_len);
		memcpy(&send_buffer[len], msg->msg_iov[i].iov_base, minimum);
		len += (unsigned int)minimum;
		remaining_bytes -= minimum;
		if (remaining_bytes == 0) {
			return (ssize_t)bytes_to_send;
		}
	}

	return (ssize_t)bytes_to_send;
}